

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

void Extra_TruthCofactor1(uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilTruth.c"
                  ,0x194,"void Extra_TruthCofactor1(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0xaaaaaaaa) >> 1 | pTruth[uVar3] & 0xaaaaaaaa;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 1:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0xcccccccc) >> 2 | pTruth[uVar3] & 0xcccccccc;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 2:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0xf0f0f0f0) >> 4 | pTruth[uVar3] & 0xf0f0f0f0;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 3:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0xff00ff00) >> 8 | pTruth[uVar3] & 0xff00ff00;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 4:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        *(undefined2 *)(pTruth + uVar3) = *(undefined2 *)((long)pTruth + uVar3 * 4 + 2);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  default:
    if (0 < (int)uVar1) {
      bVar2 = (byte)(iVar + -5);
      uVar5 = 1 << (bVar2 & 0x1f);
      iVar4 = 2 << (bVar2 & 0x1f);
      uVar3 = 1;
      if (1 < (int)uVar5) {
        uVar3 = (ulong)uVar5;
      }
      puVar6 = pTruth + (int)uVar5;
      iVar7 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar8 = 0;
          do {
            pTruth[uVar8] = puVar6[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
        iVar7 = iVar7 + iVar4;
        puVar6 = puVar6 + iVar4;
        pTruth = pTruth + iVar4;
      } while (iVar7 < (int)uVar1);
    }
  }
  return;
}

Assistant:

void Extra_TruthCofactor1( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xAAAAAAAA) | ((pTruth[i] & 0xAAAAAAAA) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xCCCCCCCC) | ((pTruth[i] & 0xCCCCCCCC) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xF0F0F0F0) | ((pTruth[i] & 0xF0F0F0F0) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xFF00FF00) | ((pTruth[i] & 0xFF00FF00) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0xFFFF0000) | ((pTruth[i] & 0xFFFF0000) >> 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pTruth[i] = pTruth[Step+i];
            pTruth += 2*Step;
        }
        return;
    }
}